

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.cpp
# Opt level: O0

int musl_getopt_long(int argc,char **argv,char *optstring,option *longopts,int *idx,int longonly)

{
  int dest;
  int iVar1;
  int local_48;
  int cnt;
  int i_1;
  int i;
  int resumed;
  int skipped;
  int ret;
  int longonly_local;
  int *idx_local;
  option *longopts_local;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  
  if ((musl_optind == 0) || (musl_optreset != 0)) {
    musl_optreset = 0;
    musl_optpos = 0;
    musl_optind = 1;
  }
  dest = musl_optind;
  if ((musl_optind < argc) && (argv[musl_optind] != (char *)0x0)) {
    if ((*optstring == '+') || (*optstring == '-')) {
LAB_0011df43:
      iVar1 = musl_optind;
      argv_local._4_4_ = musl_getopt_long_core(argc,argv,optstring,longopts,idx,longonly);
      if (dest < iVar1) {
        iVar1 = musl_optind - iVar1;
        for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
          permute(argv,dest,musl_optind + -1);
        }
        musl_optind = dest + iVar1;
      }
    }
    else {
      for (cnt = musl_optind; (cnt < argc && (argv[cnt] != (char *)0x0)); cnt = cnt + 1) {
        if ((*argv[cnt] == '-') && (argv[cnt][1] != '\0')) {
          musl_optind = cnt;
          goto LAB_0011df43;
        }
      }
      argv_local._4_4_ = -1;
    }
  }
  else {
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

static int musl_getopt_long(int argc, char **argv, char const *optstring,
			    const struct option *longopts, int *idx, int longonly)
{
	int ret, skipped, resumed;

	if (!musl_optind || musl_optreset) {
		musl_optreset = 0;
		musl_optpos = 0;
		musl_optind = 1;
	}

	if (musl_optind >= argc || !argv[musl_optind])
		return -1;

	skipped = musl_optind;
	if (optstring[0] != '+' && optstring[0] != '-') {
		int i;
		for (i = musl_optind; ; i++) {
			if (i >= argc || !argv[i])
				return -1;
			if (argv[i][0] == '-' && argv[i][1])
				break;
		}
		musl_optind = i;
	}
	resumed = musl_optind;
	ret = musl_getopt_long_core(argc, argv, optstring, longopts, idx, longonly);
	if (resumed > skipped) {
		int i, cnt = musl_optind - resumed;

		for (i = 0; i < cnt; i++)
			permute(argv, skipped, musl_optind - 1);
		musl_optind = skipped + cnt;
	}
	return ret;
}